

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Clara::Detail::TokenStream::loadBuffer(TokenStream *this)

{
  StringRef sr;
  bool bVar1;
  char cVar2;
  pointer this_00;
  reference pSVar3;
  size_t sVar4;
  size_type sVar5;
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *pvVar6;
  __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
  *in_RDI;
  size_t i;
  size_t delimiterPos;
  StringRef next;
  value_type *in_stack_ffffffffffffff18;
  value_type *__x;
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
  *in_stack_ffffffffffffff20;
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *this_01;
  char *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
  *start;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 uVar7;
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *local_68;
  StringRef local_18;
  
  std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::clear
            ((vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *)
             0x185245);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
                        *)in_stack_ffffffffffffff20,
                       (__normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
                        *)in_stack_ffffffffffffff18);
    uVar7 = false;
    if (bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
                ::operator->(in_RDI);
      uVar7 = StringRef::empty(this_00);
    }
    if ((bool)uVar7 == false) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
    ::operator++(in_RDI);
  }
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
                      *)in_stack_ffffffffffffff20,
                     (__normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
                      *)in_stack_ffffffffffffff18);
  if (bVar1) {
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
             ::operator*(in_RDI);
    local_18.m_start = pSVar3->m_start;
    local_18.m_size = pSVar3->m_size;
    cVar2 = StringRef::operator[](&local_18,0);
    bVar1 = anon_unknown.dwarf_18d5be::isOptPrefix(cVar2);
    if (bVar1) {
      sr.m_size = in_stack_ffffffffffffff38;
      sr.m_start = in_stack_ffffffffffffff30;
      sVar4 = anon_unknown.dwarf_18d5be::find_first_separator(sr);
      if (sVar4 == 0xffffffffffffffff) {
        cVar2 = StringRef::operator[](&local_18,1);
        if ((cVar2 == '-') || (sVar5 = StringRef::size(&local_18), sVar5 < 3)) {
          std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
          push_back(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        }
        else {
          local_68 = (vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                      *)0x1;
          while (this_01 = local_68,
                pvVar6 = (vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                          *)StringRef::size(&local_18), this_01 < pvVar6) {
            __x = (value_type *)(in_RDI + 2);
            StringRef::substr((StringRef *)CONCAT17(uVar7,in_stack_ffffffffffffff40),
                              in_stack_ffffffffffffff38,(size_type)in_stack_ffffffffffffff30);
            std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
            push_back(this_01,__x);
            local_68 = (vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                        *)((long)&(local_68->
                                  super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1);
          }
        }
      }
      else {
        StringRef::substr((StringRef *)CONCAT17(uVar7,in_stack_ffffffffffffff40),
                          in_stack_ffffffffffffff38,(size_type)in_stack_ffffffffffffff30);
        std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
        push_back(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        start = in_RDI + 2;
        sVar5 = sVar4 + 1;
        StringRef::size(&local_18);
        StringRef::substr((StringRef *)CONCAT17(uVar7,in_stack_ffffffffffffff40),(size_type)start,
                          sVar5);
        std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
        push_back(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
    }
    else {
      std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
      push_back(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
  }
  return;
}

Assistant:

void TokenStream::loadBuffer() {
                m_tokenBuffer.clear();

                // Skip any empty strings
                while ( it != itEnd && it->empty() ) {
                    ++it;
                }

                if ( it != itEnd ) {
                    StringRef next = *it;
                    if ( isOptPrefix( next[0] ) ) {
                        auto delimiterPos = find_first_separator(next);
                        if ( delimiterPos != StringRef::npos ) {
                            m_tokenBuffer.push_back(
                                { TokenType::Option,
                                  next.substr( 0, delimiterPos ) } );
                            m_tokenBuffer.push_back(
                                { TokenType::Argument,
                                  next.substr( delimiterPos + 1, next.size() ) } );
                        } else {
                            if ( next[1] != '-' && next.size() > 2 ) {
                                // Combined short args, e.g. "-ab" for "-a -b"
                                for ( size_t i = 1; i < next.size(); ++i ) {
                                    m_tokenBuffer.push_back(
                                        { TokenType::Option,
                                          next.substr( i, 1 ) } );
                                }
                            } else {
                                m_tokenBuffer.push_back(
                                    { TokenType::Option, next } );
                            }
                        }
                    } else {
                        m_tokenBuffer.push_back(
                            { TokenType::Argument, next } );
                    }
                }
            }